

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_font_atlas_clear(nk_font_atlas *atlas)

{
  nk_font *pnVar1;
  nk_font *pnVar2;
  
  if (atlas == (nk_font_atlas *)0x0) {
    __assert_fail("atlas",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x2bcd,"void nk_font_atlas_clear(struct nk_font_atlas *)");
  }
  if ((atlas->temporary).alloc == (nk_plugin_alloc)0x0) {
    __assert_fail("atlas->temporary.alloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x2bce,"void nk_font_atlas_clear(struct nk_font_atlas *)");
  }
  if ((atlas->temporary).free == (nk_plugin_free)0x0) {
    __assert_fail("atlas->temporary.free",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x2bcf,"void nk_font_atlas_clear(struct nk_font_atlas *)");
  }
  if ((atlas->permanent).alloc != (nk_plugin_alloc)0x0) {
    if ((atlas->permanent).free != (nk_plugin_free)0x0) {
      nk_font_atlas_cleanup(atlas);
      pnVar2 = atlas->fonts;
      if (atlas->fonts != (nk_font *)0x0) {
        while (pnVar2 != (nk_font *)0x0) {
          pnVar1 = pnVar2->next;
          (*(atlas->permanent).free)((atlas->permanent).userdata,pnVar2);
          pnVar2 = pnVar1;
        }
        atlas->fonts = (nk_font *)0x0;
      }
      if (atlas->glyphs != (nk_font_glyph *)0x0) {
        (*(atlas->permanent).free)((atlas->permanent).userdata,atlas->glyphs);
      }
      nk_zero(atlas,400);
      return;
    }
    __assert_fail("atlas->permanent.free",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x2bd1,"void nk_font_atlas_clear(struct nk_font_atlas *)");
  }
  __assert_fail("atlas->permanent.alloc",
                "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                ,0x2bd0,"void nk_font_atlas_clear(struct nk_font_atlas *)");
}

Assistant:

NK_API void
nk_font_atlas_clear(struct nk_font_atlas *atlas)
{
    NK_ASSERT(atlas);
    NK_ASSERT(atlas->temporary.alloc);
    NK_ASSERT(atlas->temporary.free);
    NK_ASSERT(atlas->permanent.alloc);
    NK_ASSERT(atlas->permanent.free);
    if (!atlas || !atlas->permanent.alloc || !atlas->permanent.free) return;

    nk_font_atlas_cleanup(atlas);
    if (atlas->fonts) {
        struct nk_font *iter, *next;
        for (iter = atlas->fonts; iter; iter = next) {
            next = iter->next;
            atlas->permanent.free(atlas->permanent.userdata, iter);
        }
        atlas->fonts = 0;
    }
    if (atlas->glyphs)
        atlas->permanent.free(atlas->permanent.userdata, atlas->glyphs);
    nk_zero_struct(*atlas);
}